

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

string * __thiscall
testing::internal::GetPrefixUntilComma_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *str)

{
  char *pcVar1;
  allocator<char> local_11;
  
  pcVar1 = strchr((char *)this,0x2c);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)this,&local_11);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,this,pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetPrefixUntilComma(const char* str) {
  const char* comma = strchr(str, ',');
  return comma == NULL ? str : std::string(str, comma);
}